

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetVideo(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var3;
  size_type sVar4;
  element_type *peVar5;
  type_conflict4 tVar6;
  undefined8 *puVar7;
  self_type *psVar8;
  iterator iVar9;
  optional<int> oVar10;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  path_type *data_00;
  Ptr PVar12;
  locale local_90 [8];
  type local_88;
  path_type local_68;
  element_type *local_38;
  
  *(undefined8 *)this = 0;
  puVar7 = (undefined8 *)operator_new(0x78);
  puVar7[1] = 0x100000001;
  *puVar7 = &PTR___Sp_counted_ptr_inplace_002aa380;
  puVar7[2] = 0;
  puVar7[3] = 0;
  puVar7[4] = 0;
  puVar7[5] = 0;
  puVar7[10] = 0;
  puVar7[0xb] = 0;
  puVar7[0xc] = 0;
  puVar7[0xd] = 0;
  puVar7[6] = 0;
  puVar7[7] = 0;
  puVar7[0xe] = 0;
  puVar7[2] = puVar7 + 4;
  puVar7[3] = 0;
  *(undefined1 *)(puVar7 + 4) = 0;
  puVar7[8] = 0;
  puVar7[9] = 0;
  puVar7[10] = puVar7 + 0xc;
  puVar7[0xb] = 0;
  *(undefined1 *)(puVar7 + 0xc) = 0;
  *(undefined8 **)(this + 8) = puVar7;
  *(string **)this = (string *)(puVar7 + 2);
  paVar1 = &local_68.m_value.field_2;
  local_68.m_value._M_dataplus._M_p = (pointer)paVar1;
  local_38 = (element_type *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"file_id","");
  local_68.m_separator = '.';
  local_68.m_start._M_current = local_68.m_value._M_dataplus._M_p;
  psVar8 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_68);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (&local_88,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)psVar8);
  std::__cxx11::string::operator=((string *)(puVar7 + 2),(string *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.m_value._M_dataplus._M_p);
  }
  local_68.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"width","");
  local_68.m_separator = '.';
  local_68.m_start._M_current = local_68.m_value._M_dataplus._M_p;
  psVar8 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_68);
  std::locale::locale(local_90);
  std::locale::locale((locale *)&local_88,local_90);
  tVar6 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar8,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)
                     &local_88);
  std::locale::~locale((locale *)&local_88);
  std::locale::~locale(local_90);
  *(type_conflict4 *)(puVar7 + 6) = tVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.m_value._M_dataplus._M_p);
  }
  local_68.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"height","");
  local_68.m_separator = '.';
  local_68.m_start._M_current = local_68.m_value._M_dataplus._M_p;
  psVar8 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_68);
  std::locale::locale(local_90);
  std::locale::locale((locale *)&local_88,local_90);
  tVar6 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar8,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)
                     &local_88);
  std::locale::~locale((locale *)&local_88);
  std::locale::~locale(local_90);
  *(type_conflict4 *)((long)puVar7 + 0x34) = tVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.m_value._M_dataplus._M_p);
  }
  local_68.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"duration","");
  local_68.m_separator = '.';
  local_68.m_start._M_current = local_68.m_value._M_dataplus._M_p;
  psVar8 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_68);
  std::locale::locale(local_90);
  std::locale::locale((locale *)&local_88,local_90);
  tVar6 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar8,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)
                     &local_88);
  std::locale::~locale((locale *)&local_88);
  std::locale::~locale(local_90);
  peVar5 = local_38;
  pcVar2 = (local_38->fileId)._M_dataplus._M_p;
  *(type_conflict4 *)(pcVar2 + 0x28) = tVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.m_value._M_dataplus._M_p);
  }
  local_68.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"thumb","");
  data_00 = &local_68;
  iVar9 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&data_00->m_value);
  if (iVar9.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
  }
  else {
    parseJsonAndGetPhotoSize((TgTypeParser *)&local_88,(ptree *)data_00);
  }
  sVar4 = local_88._M_string_length;
  _Var3._M_p = local_88._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pcVar2 + 0x38);
  *(pointer *)(pcVar2 + 0x30) = _Var3._M_p;
  *(size_type *)(pcVar2 + 0x38) = sVar4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.m_value._M_dataplus._M_p);
  }
  local_68.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"mime_type","");
  local_68.m_separator = '.';
  local_68.m_start._M_current = local_68.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_88,in_RDX,&local_68,"");
  std::__cxx11::string::operator=((string *)(pcVar2 + 0x40),(string *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.m_value._M_dataplus._M_p);
  }
  local_68.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"file_size","");
  local_68.m_separator = '.';
  local_68.m_start._M_current = local_68.m_value._M_dataplus._M_p;
  oVar10 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_optional<int>(in_RDX,&local_68);
  _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (((ulong)oVar10.super_type & 1) != 0) {
    _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((ulong)oVar10.super_type >> 0x20);
  }
  *(int *)(pcVar2 + 0x60) = (int)_Var11._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.m_value._M_dataplus._M_p);
    _Var11._M_pi = extraout_RDX;
  }
  PVar12.super___shared_ptr<TgBot::Video,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  PVar12.super___shared_ptr<TgBot::Video,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  return (Ptr)PVar12.super___shared_ptr<TgBot::Video,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Video::Ptr TgTypeParser::parseJsonAndGetVideo(const ptree& data) const {
    auto result(make_shared<Video>());
    result->fileId = data.get<string>("file_id");
    result->width = data.get<int32_t>("width");
    result->height = data.get<int32_t>("height");
    result->duration = data.get<int32_t>("duration");
    result->thumb = tryParseJson<PhotoSize>(&TgTypeParser::parseJsonAndGetPhotoSize, data, "thumb");
    result->mimeType = data.get("mime_type", "");
    result->fileSize = data.get("file_size", 0);
    return result;
}